

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseModuleCommand(WastParser *this,Script *script,CommandPtr *out_command)

{
  pointer *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Result result;
  ScriptModuleType SVar2;
  pointer pMVar3;
  Module *this_01;
  pointer pSVar4;
  TextScriptModule *pTVar5;
  DataScriptModule<(wabt::ScriptModuleType)1> *pDVar6;
  uchar *data;
  char *pcVar7;
  undefined8 uVar8;
  size_type sVar9;
  ulong uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  Binding local_1a8;
  Index local_180;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_17c;
  undefined1 local_17b;
  allocator local_17a;
  allocator local_179;
  Index command_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150 [32];
  iterator local_130;
  size_type local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  char *local_108;
  size_type sStack_100;
  size_t local_f8;
  undefined8 uStack_f0;
  char *local_e8;
  size_type sStack_e0;
  size_t local_d8;
  undefined8 uStack_d0;
  reference local_c8;
  Error *error;
  iterator __end3;
  iterator __begin3;
  Errors *__range3;
  char *filename;
  Errors errors;
  ReadBinaryOptions options;
  DataScriptModule<(wabt::ScriptModuleType)1> *bsm;
  Module *module;
  unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> command;
  unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_> local_30;
  unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_> script_module;
  CommandPtr *out_command_local;
  Script *script_local;
  WastParser *this_local;
  
  script_module._M_t.
  super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>._M_t.
  super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>.
  super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>,_true,_true>)
       (__uniq_ptr_data<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>,_true,_true>)
       out_command;
  std::unique_ptr<wabt::ScriptModule,std::default_delete<wabt::ScriptModule>>::
  unique_ptr<std::default_delete<wabt::ScriptModule>,void>
            ((unique_ptr<wabt::ScriptModule,std::default_delete<wabt::ScriptModule>> *)&local_30);
  result = ParseScriptModule(this,&local_30);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    command._M_t.
    super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t.
    super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
    super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl._0_4_ = 1;
    goto LAB_016d6731;
  }
  MakeUnique<wabt::ModuleCommand>();
  pMVar3 = std::unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>::
           operator->((unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> *)
                      &module);
  this_01 = &pMVar3->module;
  pSVar4 = std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::operator->
                     (&local_30);
  SVar2 = ScriptModule::type(pSVar4);
  if (SVar2 == Text) {
    pSVar4 = std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::get
                       (&local_30);
    pTVar5 = cast<wabt::TextScriptModule,wabt::ScriptModule>(pSVar4);
    Module::operator=(this_01,&pTVar5->module);
LAB_016d6659:
    if (script != (Script *)0x0) {
      sVar9 = std::
              vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
              ::size(&script->commands);
      local_180 = (Index)sVar9;
      uVar10 = std::__cxx11::string::empty((string *)&(pMVar3->module).name);
      if ((uVar10 & 1) == 0) {
        Binding::Binding(&local_1a8,&this_01->loc,local_180);
        std::
        unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
        ::emplace<std::__cxx11::string&,wabt::Binding>
                  ((unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                    *)&script->module_bindings,&(pMVar3->module).name,&local_1a8);
      }
      this->last_module_index_ = local_180;
    }
    std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>::operator=
              ((unique_ptr<wabt::Command,std::default_delete<wabt::Command>> *)
               script_module._M_t.
               super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>.
               _M_t.
               super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>
               .super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl,
               (unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> *)&module
              );
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    if (SVar2 == Binary) {
      pSVar4 = std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::get
                         (&local_30);
      pDVar6 = cast<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,wabt::ScriptModule>(pSVar4);
      this_00 = &errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      ReadBinaryOptions::ReadBinaryOptions((ReadBinaryOptions *)this_00);
      std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
                ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&filename);
      data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&pDVar6->data);
      sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pDVar6->data);
      ReadBinaryIr("<text>",data,sVar9,(ReadBinaryOptions *)this_00,
                   (vector<wabt::Error,_std::allocator<wabt::Error>_> *)&filename,this_01);
      std::__cxx11::string::operator=((string *)&(pMVar3->module).name,(string *)&pDVar6->name);
      (this_01->loc).filename.data_ = (pDVar6->loc).filename.data_;
      (pMVar3->module).loc.filename.size_ = (pDVar6->loc).filename.size_;
      (pMVar3->module).loc.field_1.field_1.offset = (pDVar6->loc).field_1.field_1.offset;
      *(undefined8 *)((long)&(pMVar3->module).loc.field_1 + 8) =
           *(undefined8 *)((long)&(pDVar6->loc).field_1 + 8);
      __end3 = std::vector<wabt::Error,_std::allocator<wabt::Error>_>::begin
                         ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&filename);
      error = (Error *)std::vector<wabt::Error,_std::allocator<wabt::Error>_>::end
                                 ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&filename);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<wabt::Error_*,_std::vector<wabt::Error,_std::allocator<wabt::Error>_>_>
                                         *)&error), bVar1) {
        local_c8 = __gnu_cxx::
                   __normal_iterator<wabt::Error_*,_std::vector<wabt::Error,_std::allocator<wabt::Error>_>_>
                   ::operator*(&__end3);
        if (local_c8->error_level != Error) {
          __assert_fail("error.error_level == ErrorLevel::Error",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wast-parser.cc"
                        ,0x8e4,"Result wabt::WastParser::ParseModuleCommand(Script *, CommandPtr *)"
                       );
        }
        if ((local_c8->loc).field_1.field_1.offset == 0xffffffffffffffff) {
          local_e8 = (pDVar6->loc).filename.data_;
          sStack_e0 = (pDVar6->loc).filename.size_;
          local_d8 = (pDVar6->loc).field_1.field_1.offset;
          uStack_d0 = *(undefined8 *)((long)&(pDVar6->loc).field_1 + 8);
          pcVar7 = (char *)std::__cxx11::string::c_str((string *)&local_c8->message);
          Error(this,0x19b53b7,pcVar7);
        }
        else {
          local_108 = (pDVar6->loc).filename.data_;
          sStack_100 = (pDVar6->loc).filename.size_;
          local_f8 = (pDVar6->loc).field_1.field_1.offset;
          uStack_f0 = *(undefined8 *)((long)&(pDVar6->loc).field_1 + 8);
          pcVar7 = (char *)(local_c8->loc).field_1.field_1.offset;
          uVar8 = std::__cxx11::string::c_str((string *)&local_c8->message);
          Error(this,0x19b53d2,pcVar7,uVar8);
        }
        __gnu_cxx::
        __normal_iterator<wabt::Error_*,_std::vector<wabt::Error,_std::allocator<wabt::Error>_>_>::
        operator++(&__end3);
      }
      command._M_t.
      super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t.
      super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
      super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl._0_4_ = 4;
      std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
                ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&filename);
      goto LAB_016d6659;
    }
    if (SVar2 != Quoted) goto LAB_016d6659;
    local_17b = 1;
    _command_index = &local_170;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_170,"a binary module",&local_179);
    _command_index = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,"a text module",&local_17a);
    local_17b = 0;
    local_130 = &local_170;
    local_128 = 2;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_17c);
    __l._M_len = local_128;
    __l._M_array = local_130;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_120,__l,&local_17c);
    this_local._4_4_ = ErrorExpected(this,&local_120,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_120);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_17c);
    local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130;
    do {
      local_240 = local_240 + -1;
      std::__cxx11::string::~string((string *)local_240);
    } while (local_240 != &local_170);
    std::allocator<char>::~allocator((allocator<char> *)&local_17a);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
  }
  command._M_t.super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
  ._M_t.super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
  super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl._0_4_ = 1;
  std::unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>::~unique_ptr
            ((unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> *)&module);
LAB_016d6731:
  std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::~unique_ptr
            (&local_30);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseModuleCommand(Script* script, CommandPtr* out_command) {
  WABT_TRACE(ParseModuleCommand);
  std::unique_ptr<ScriptModule> script_module;
  CHECK_RESULT(ParseScriptModule(&script_module));

  auto command = MakeUnique<ModuleCommand>();
  Module& module = command->module;

  switch (script_module->type()) {
    case ScriptModuleType::Text:
      module = std::move(cast<TextScriptModule>(script_module.get())->module);
      break;

    case ScriptModuleType::Binary: {
      auto* bsm = cast<BinaryScriptModule>(script_module.get());
      ReadBinaryOptions options;
      Errors errors;
      const char* filename = "<text>";
      ReadBinaryIr(filename, bsm->data.data(), bsm->data.size(), options,
                   &errors, &module);
      module.name = bsm->name;
      module.loc = bsm->loc;
      for (const auto& error: errors) {
        assert(error.error_level == ErrorLevel::Error);
        if (error.loc.offset == kInvalidOffset) {
          Error(bsm->loc, "error in binary module: %s", error.message.c_str());
        } else {
          Error(bsm->loc, "error in binary module: @0x%08" PRIzx ": %s",
                error.loc.offset, error.message.c_str());
        }
      }
      break;
    }

    case ScriptModuleType::Quoted:
      return ErrorExpected({"a binary module", "a text module"});
  }

  // script is nullptr when ParseModuleCommand is called from ParseModule.
  if (script) {
    Index command_index = script->commands.size();

    if (!module.name.empty()) {
      script->module_bindings.emplace(module.name,
                                      Binding(module.loc, command_index));
    }

    last_module_index_ = command_index;
  }

  *out_command = std::move(command);
  return Result::Ok;
}